

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&>
* __thiscall
Catch::ExprLhs<std::vector<int,std::allocator<int>>const&>::operator==
          (ExprLhs<const_std::vector<int,_std::allocator<int>_>_&> *this,
          vector<int,_std::allocator<int>_> *rhs)

{
  StringRef op;
  bool comparisonResult;
  vector<int,_std::allocator<int>_> *in_RSI;
  BinaryExpr<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&>
  *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  pointer piVar1;
  BinaryExpr<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&>
  *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult =
       compareEqual<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
                 (in_RSI,in_stack_ffffffffffffffa8);
  piVar1 = (in_RSI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = (char *)piVar1;
  BinaryExpr<const_std::vector<int,_std::allocator<int>_>_&,_const_std::vector<int,_std::allocator<int>_>_&>
  ::BinaryExpr(in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }